

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signaler.cpp
# Opt level: O0

ssize_t __thiscall
zmq::signaler_t::send(signaler_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint uVar1;
  uint uVar2;
  ssize_t sVar3;
  ulong uVar4;
  int *piVar5;
  char *pcVar6;
  ulong extraout_RAX;
  char *errstr;
  ssize_t sz;
  uint64_t inc;
  undefined8 local_10;
  signaler_t *local_8;
  
  uVar1 = this->pid;
  local_8 = this;
  uVar2 = getpid();
  uVar4 = (ulong)uVar1;
  if (uVar1 == uVar2) {
    local_10 = 1;
    sVar3 = ::write(this->_w,&local_10,8);
    uVar4 = CONCAT71((int7)((ulong)sVar3 >> 8),sVar3 == 8) ^ 0xff;
    if ((uVar4 & 1) != 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/signaler.cpp"
              ,0xb8);
      fflush(_stderr);
      zmq_abort((char *)0x1fd4b7);
      uVar4 = extraout_RAX;
    }
  }
  return uVar4;
}

Assistant:

void zmq::signaler_t::send ()
{
#if defined HAVE_FORK
    if (unlikely (pid != getpid ())) {
        //printf("Child process %d signaler_t::send returning without sending #1\n", getpid());
        return; // do not send anything in forked child context
    }
#endif
#if defined ZMQ_HAVE_EVENTFD
    const uint64_t inc = 1;
    ssize_t sz = write (_w, &inc, sizeof (inc));
    errno_assert (sz == sizeof (inc));
#elif defined ZMQ_HAVE_WINDOWS
    const char dummy = 0;
    int nbytes;
    do {
        nbytes = ::send (_w, &dummy, sizeof (dummy), 0);
        wsa_assert (nbytes != SOCKET_ERROR);
        // wsa_assert does not abort on WSAEWOULDBLOCK. If we get this, we retry.
    } while (nbytes == SOCKET_ERROR);
    // Given the small size of dummy (should be 1) expect that send was able to send everything.
    zmq_assert (nbytes == sizeof (dummy));
#elif defined ZMQ_HAVE_VXWORKS
    unsigned char dummy = 0;
    while (true) {
        ssize_t nbytes = ::send (_w, (char *) &dummy, sizeof (dummy), 0);
        if (unlikely (nbytes == -1 && errno == EINTR))
            continue;
#if defined(HAVE_FORK)
        if (unlikely (pid != getpid ())) {
            //printf("Child process %d signaler_t::send returning without sending #2\n", getpid());
            errno = EINTR;
            break;
        }
#endif
        zmq_assert (nbytes == sizeof dummy);
        break;
    }
#else
    unsigned char dummy = 0;
    while (true) {
        ssize_t nbytes = ::send (_w, &dummy, sizeof (dummy), 0);
        if (unlikely (nbytes == -1 && errno == EINTR))
            continue;
#if defined(HAVE_FORK)
        if (unlikely (pid != getpid ())) {
            //printf("Child process %d signaler_t::send returning without sending #2\n", getpid());
            errno = EINTR;
            break;
        }
#endif
        zmq_assert (nbytes == sizeof dummy);
        break;
    }
#endif
}